

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

void anon_unknown.dwarf_1250c1::writeTimestamp(uint8_t *buffer,time_t time)

{
  undefined1 auVar1 [16];
  tm *ptVar2;
  tm *ptVar3;
  time_t tVar4;
  time_t tVar5;
  time_t local_28;
  
  local_28 = time;
  ptVar2 = localtime(&local_28);
  ptVar3 = localtime(&local_28);
  tVar4 = mktime(ptVar3);
  ptVar3 = gmtime(&local_28);
  tVar5 = mktime(ptVar3);
  auVar1 = SEXT816(tVar4 - tVar5) * ZEXT816(0x8888888888888889);
  *(ushort *)buffer = (short)(auVar1._8_4_ >> 5) - (auVar1._14_2_ >> 0xf) & 0xfffU | 0x1000;
  *(short *)(buffer + 2) = (short)ptVar2->tm_year + 0x76c;
  buffer[4] = (char)ptVar2->tm_mon + '\x01';
  buffer[5] = (uint8_t)ptVar2->tm_mday;
  buffer[6] = (uint8_t)ptVar2->tm_hour;
  buffer[7] = (uint8_t)ptVar2->tm_min;
  buffer[8] = (uint8_t)ptVar2->tm_sec;
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  return;
}

Assistant:

void writeTimestamp(uint8_t *buffer, const time_t time)
{
    const auto buff16 = reinterpret_cast<uint16_t *>(buffer);

    const tm *parts = localtime(&time);

    const time_t lt = mktime(localtime(&time));
    const time_t gt = mktime(gmtime(&time));
    const auto timeZone = static_cast<int16_t>((lt - gt) / 60);

    buff16[0] = (1 << 12) + (timeZone & 0x0fff);
    buff16[1] = static_cast<int16_t>(parts->tm_year + 1900);
    buffer[4] = static_cast<uint8_t>(parts->tm_mon + 1);
    buffer[5] = static_cast<uint8_t>(parts->tm_mday);
    buffer[6] = static_cast<uint8_t>(parts->tm_hour);
    buffer[7] = static_cast<uint8_t>(parts->tm_min);
    buffer[8] = static_cast<uint8_t>(parts->tm_sec);
    buffer[9] = 0;  // ms parts
    buffer[10] = 0;
    buffer[11] = 0;
}